

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MinMaxBase::
     ConstantOperation<duckdb::uhugeint_t,duckdb::MinMaxState<duckdb::uhugeint_t>,duckdb::MinOperation>
               (MinMaxState<duckdb::uhugeint_t> *state,uhugeint_t *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  uint64_t uVar1;
  
  uVar1 = input->upper;
  if (state->isset != false) {
    MinOperation::Execute<duckdb::uhugeint_t,duckdb::MinMaxState<duckdb::uhugeint_t>>
              (state,*input,unary_input->input);
    return;
  }
  (state->value).lower = input->lower;
  (state->value).upper = uVar1;
  state->isset = true;
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		if (!state.isset) {
			OP::template Assign<INPUT_TYPE, STATE>(state, input, unary_input.input);
			state.isset = true;
		} else {
			OP::template Execute<INPUT_TYPE, STATE>(state, input, unary_input.input);
		}
	}